

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_formats.c
# Opt level: O0

FMStructDescList get_localized_formats_dill(FMFormat f,dill_stream_conflict s)

{
  FMStructDescList p_Var1;
  dill_stream_conflict in_RSI;
  FMStructDescList in_RDI;
  bool bVar2;
  FMFormat unaff_retaddr;
  int i;
  int subformat_count;
  FMStructDescList ret_list;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar3;
  int iVar4;
  
  iVar4 = 0;
  while( true ) {
    bVar2 = false;
    if (*(long *)&in_RDI[3].struct_size != 0) {
      bVar2 = *(long *)(*(long *)&in_RDI[3].struct_size + (long)iVar4 * 8) != 0;
    }
    if (!bVar2) break;
    iVar4 = iVar4 + 1;
  }
  p_Var1 = (FMStructDescList)ffs_malloc(CONCAT44(iVar4,in_stack_ffffffffffffffe0));
  p_Var1[iVar4 + 1].format_name = (char *)0x0;
  p_Var1[iVar4 + 1].field_list = (FMFieldList)0x0;
  p_Var1[iVar4 + 1].struct_size = 0;
  p_Var1[iVar4 + 1].opt_info = (FMOptInfo *)0x0;
  for (iVar3 = 0; iVar3 < iVar4; iVar3 = iVar3 + 1) {
    generate_localized_subformat(unaff_retaddr,in_RDI,in_RSI);
  }
  generate_localized_subformat(unaff_retaddr,in_RDI,in_RSI);
  return p_Var1;
}

Assistant:

extern FMStructDescList
get_localized_formats_dill(FMFormat f, dill_stream s)
{
    FMStructDescList ret_list;
    int subformat_count = 0;
    while(f->subformats && (f->subformats[subformat_count] != NULL)) {
	subformat_count++;
    }
    ret_list = malloc(sizeof(ret_list[0]) * (subformat_count+2));
    int i = 0;
    ret_list[subformat_count+1].format_name = NULL;
    ret_list[subformat_count+1].field_list = NULL;
    ret_list[subformat_count+1].struct_size = 0;
    ret_list[subformat_count+1].opt_info = 0;
    for (i=0; i < subformat_count; i++) {
	generate_localized_subformat(f->subformats[subformat_count-i-1], &ret_list[subformat_count - i], s);
    }
    generate_localized_subformat(f, ret_list, s);
    return ret_list;
}